

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLock.cxx
# Opt level: O0

void __thiscall cmFileLock::~cmFileLock(cmFileLock *this)

{
  bool bVar1;
  ulong uVar2;
  cmFileLockResult local_18;
  cmFileLockResult result;
  cmFileLock *this_local;
  
  result = (cmFileLockResult)this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_18 = Release(this);
    bVar1 = cmFileLockResult::IsOk(&local_18);
    if (!bVar1) {
      __assert_fail("result.IsOk()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFileLock.cxx"
                    ,0x1c,"cmFileLock::~cmFileLock()");
    }
  }
  std::__cxx11::string::~string((string *)&this->Filename);
  return;
}

Assistant:

cmFileLock::~cmFileLock()
{
  if (!this->Filename.empty()) {
    const cmFileLockResult result = this->Release();
    static_cast<void>(result);
    assert(result.IsOk());
  }
}